

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O3

void __thiscall Cleaner::Reset(Cleaner *this)

{
  this->status_ = 0;
  this->cleaned_files_count_ = 0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->removed_)._M_t);
  std::_Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>
  ::clear(&(this->cleaned_)._M_t);
  return;
}

Assistant:

void Cleaner::Reset() {
  status_ = 0;
  cleaned_files_count_ = 0;
  removed_.clear();
  cleaned_.clear();
}